

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O0

void aes_ctr_xor_x86(aes_context *ctx,uint8_t *iv,uint8_t *buffer,size_t size)

{
  uint32_t *puVar1;
  int nr;
  __m128i *key_00;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qb;
  __m128i input;
  __m128i counter_00;
  __m128i alVar4;
  __m128i tmp_1;
  __m128i block_1;
  uint8_t full [16];
  __m128i tmp;
  __m128i block;
  __m128i counter;
  __m128i *key;
  size_t size_local;
  uint8_t *buffer_local;
  uint8_t *iv_local;
  aes_context *ctx_local;
  ulong uVar2;
  uint32_t *puVar3;
  
  nr = (int)size;
  puVar1 = ctx->key;
  size_local = (size_t)buffer;
  for (key = (__m128i *)size; (__m128i *)0xf < key; key = key + -1) {
    input[1]._0_4_ = ctx->nr;
    input[0] = (longlong)puVar1;
    input[1]._4_4_ = 0;
    uVar2 = (ulong)(uint)ctx->nr;
    puVar3 = puVar1;
    aes_encrypt_x86(input,(__m128i *)buffer,nr);
    *(ulong *)size_local = *(ulong *)size_local ^ extraout_XMM0_Qa;
    *(ulong *)(size_local + 8) = *(ulong *)(size_local + 8) ^ extraout_XMM0_Qb;
    counter_00[1] = uVar2;
    counter_00[0] = (longlong)puVar3;
    alVar4 = ctr_increment(counter_00);
    buffer = alVar4[1];
    size_local = size_local + 0x10;
  }
  if (key != (__m128i *)0x0) {
    memcpy(block_1 + 1,(void *)size_local,(size_t)key);
    memset((void *)((long)(block_1 + 1) + (long)key),0,0x10 - (long)key);
    alVar4[1]._0_4_ = ctx->nr;
    alVar4[0] = (longlong)puVar1;
    alVar4[1]._4_4_ = 0;
    aes_encrypt_x86(alVar4,key_00,nr);
    block_1[1] = block_1[1] ^ extraout_XMM0_Qa_00;
    memcpy((void *)size_local,block_1 + 1,(size_t)key);
  }
  return;
}

Assistant:

void aes_ctr_xor_x86(const aes_context* ctx, const uint8_t* iv, uint8_t* buffer, size_t size)
{
  const __m128i* key = (__m128i*)ctx->key;
  __m128i counter = _mm_loadu_si128((const __m128i*)iv);

  while (size >= 16)
  {
    __m128i block = aes_encrypt_x86(counter, key, ctx->nr);
    __m128i tmp = _mm_xor_si128(_mm_loadu_si128((const __m128i*)buffer), block);
    _mm_storeu_si128((__m128i*)buffer, tmp);

    counter = ctr_increment(counter);

    buffer += 16;
    size -= 16;
  }

  if (size != 0)
  {
    uint8_t full[16];
    memcpy(full, buffer, size);
    memset(full + size, 0, 16 - size);

    __m128i block = aes_encrypt_x86(counter, key, ctx->nr);
    __m128i tmp = _mm_xor_si128(_mm_loadu_si128((const __m128i*)full), block);
    _mm_storeu_si128((__m128i*)full, tmp);

    memcpy(buffer, full, size);
  }
}